

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generated_code.cc
# Opt level: O0

void __thiscall GeneratedCode_UTF8_Test::TestBody(GeneratedCode_UTF8_Test *this)

{
  bool bVar1;
  protobuf_test_messages_proto3_TestAllTypesProto3 *ppVar2;
  char *pcVar3;
  upb_StringView value;
  AssertHelper local_98;
  Message local_90 [3];
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  protobuf_test_messages_proto3_TestAllTypesProto3 *msg2;
  protobuf_test_messages_proto3_TestAllTypesProto3 *msg;
  upb_StringView serialized;
  upb_Arena *arena;
  upb_StringView invalid_utf8_view;
  char invalid_utf8 [2];
  GeneratedCode_UTF8_Test *this_local;
  
  invalid_utf8_view.size._6_2_ = 0xff;
  value = ::upb_StringView_FromDataAndSize((char *)((long)&invalid_utf8_view.size + 6),1);
  serialized.size = (size_t)upb_Arena_New();
  ppVar2 = protobuf_test_messages_proto3_TestAllTypesProto3_new((upb_Arena *)serialized.size);
  arena = (upb_Arena *)value.data;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )arena;
  protobuf_test_messages_proto3_TestAllTypesProto3_set_optional_string(ppVar2,value);
  pcVar3 = protobuf_test_messages_proto3_TestAllTypesProto3_serialize
                     (ppVar2,(upb_Arena *)serialized.size,(size_t *)&serialized);
  ppVar2 = protobuf_test_messages_proto3_TestAllTypesProto3_parse
                     (pcVar3,(size_t)serialized.data,(upb_Arena *)serialized.size);
  testing::internal::EqHelper::Compare<protobuf_test_messages_proto3_TestAllTypesProto3>
            ((EqHelper *)local_78,"nullptr","msg2",(nullptr_t)0x0,ppVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/test/test_generated_code.cc"
               ,0x1ef,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  upb_Arena_Free((upb_Arena *)serialized.size);
  return;
}

Assistant:

TEST(GeneratedCode, UTF8) {
  const char invalid_utf8[] = "\xff";
  const upb_StringView invalid_utf8_view =
      upb_StringView_FromDataAndSize(invalid_utf8, 1);
  upb_Arena* arena = upb_Arena_New();
  upb_StringView serialized;
  protobuf_test_messages_proto3_TestAllTypesProto3* msg =
      protobuf_test_messages_proto3_TestAllTypesProto3_new(arena);
  protobuf_test_messages_proto3_TestAllTypesProto3* msg2;

  protobuf_test_messages_proto3_TestAllTypesProto3_set_optional_string(
      msg, invalid_utf8_view);

  serialized.data = protobuf_test_messages_proto3_TestAllTypesProto3_serialize(
      msg, arena, &serialized.size);

  msg2 = protobuf_test_messages_proto3_TestAllTypesProto3_parse(
      serialized.data, serialized.size, arena);
  EXPECT_EQ(nullptr, msg2);

  upb_Arena_Free(arena);
}